

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context *context;
  string *psVar1;
  ImmutableFieldGenerator *pIVar2;
  Descriptor *pDVar3;
  OneofGeneratorInfo *pOVar4;
  ClassNameResolver *this_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  int i;
  long lVar5;
  char *pcVar6;
  long lVar7;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&local_b0,"OrBuilder",(allocator *)&local_90);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar3,true,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  pDVar3 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar3 + 0x68) < 1) {
    pcVar6 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar6 = "@java.lang.Deprecated ";
    }
    std::__cxx11::string::string((string *)&local_b0,pcVar6,(allocator *)&local_50);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_90,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    std::__cxx11::string::string((string *)&local_70,"",&local_b2);
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
                       ,"deprecation",&local_b0,"extra_interfaces",&local_90,"classname",psVar1,
                       "idend",&local_70);
  }
  else {
    pcVar6 = "";
    if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x6a) != '\0') {
      pcVar6 = "@java.lang.Deprecated ";
    }
    std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_b2);
    ExtraMessageOrBuilderInterfaces_abi_cxx11_
              (&local_90,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    psVar1 = *(string **)(this->super_MessageGenerator).descriptor_;
    std::__cxx11::string::string((string *)&local_70,"",&local_b1);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    io::Printer::Print(printer,
                       "$deprecation$public interface $classname$OrBuilder$idend$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage$ver$.\n        ExtendableMessageOrBuilder<$classname$> {\n"
                       ,"deprecation",&local_b0,"extra_interfaces",&local_90,"classname",psVar1,
                       "idend",&local_70,"ver",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"classname","idend",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  lVar7 = 0;
  for (lVar5 = 0; pDVar3 = (this->super_MessageGenerator).descriptor_,
      lVar5 < *(int *)(pDVar3 + 0x2c); lVar5 = lVar5 + 1) {
    io::Printer::Print(printer,"\n");
    pIVar2 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) + lVar7));
    (*pIVar2->_vptr_ImmutableFieldGenerator[4])(pIVar2,printer);
    lVar7 = lVar7 + 0xa8;
  }
  lVar7 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(pDVar3 + 0x38); lVar5 = lVar5 + 1) {
    pOVar4 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar3 + 0x40) + lVar7));
    this_00 = Context::GetNameResolver(this->context_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_b0,this_00,(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,
                       "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                       ,"oneof_capitalized_name",&pOVar4->capitalized_name,"classname",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    pDVar3 = (this->super_MessageGenerator).descriptor_;
    lVar7 = lVar7 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage$ver$.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "", "ver", GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "$deprecation$public interface $classname$OrBuilder$idend$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation", descriptor_->options().deprecated() ?
            "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(),
        "idend", "");
  }
  printer->Annotate("classname", "idend", descriptor_);

  printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      printer->Print("\n");
      field_generators_.get(descriptor_->field(i))
                       .GenerateInterfaceMembers(printer);
    }
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
          "\n"
          "public $classname$.$oneof_capitalized_name$Case "
          "get$oneof_capitalized_name$Case();\n",
          "oneof_capitalized_name",
          context_->GetOneofGeneratorInfo(
              descriptor_->oneof_decl(i))->capitalized_name,
          "classname",
          context_->GetNameResolver()->GetImmutableClassName(
              descriptor_));
    }
  printer->Outdent();

  printer->Print("}\n");
}